

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

void * __thiscall tinyxml2::MemPoolT<120>::Alloc(MemPoolT<120> *this)

{
  Item *pIVar1;
  Item *result;
  int i;
  Item *blockItems;
  Block *block;
  MemPoolT<120> *this_local;
  
  if (this->_root == (Item *)0x0) {
    pIVar1 = (Item *)operator_new(0xff0);
    memset(pIVar1,0,0xff0);
    DynArray<tinyxml2::MemPoolT<120>::Block_*,_10>::Push(&this->_blockPtrs,(Block *)pIVar1);
    for (result._4_4_ = 0; result._4_4_ < 0x21; result._4_4_ = result._4_4_ + 1) {
      pIVar1[result._4_4_].next = pIVar1 + (result._4_4_ + 1);
    }
    pIVar1[0x21].next = (Item *)0x0;
    this->_root = pIVar1;
  }
  pIVar1 = this->_root;
  this->_root = this->_root->next;
  this->_currentAllocs = this->_currentAllocs + 1;
  if (this->_maxAllocs < this->_currentAllocs) {
    this->_maxAllocs = this->_currentAllocs;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return pIVar1;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            Item* blockItems = block->items;
            for( int i = 0; i < ITEMS_PER_BLOCK - 1; ++i ) {
                blockItems[i].next = &(blockItems[i + 1]);
            }
            blockItems[ITEMS_PER_BLOCK - 1].next = 0;
            _root = blockItems;
        }
        Item* const result = _root;
        TIXMLASSERT( result != 0 );
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        ++_nAllocs;
        ++_nUntracked;
        return result;
    }